

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::DummyDataParameter::InternalSerializeWithCachedSizesToArray
          (DummyDataParameter *this,bool deterministic,uint8 *target)

{
  int iVar1;
  Type *value;
  uint8 *puVar2;
  Type *value_00;
  UnknownFieldSet *unknown_fields;
  int iVar3;
  
  iVar1 = (this->data_filler_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar3 = 0; iVar1 != iVar3; iVar3 = iVar3 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::FillerParameter>::TypeHandler>
                      (&(this->data_filler_).super_RepeatedPtrFieldBase,iVar3);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                       (1,value,deterministic,target);
  }
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(2,&this->num_,target);
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3,&this->channels_,puVar2)
  ;
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(4,&this->height_,puVar2);
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5,&this->width_,puVar2);
  iVar1 = (this->shape_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar3 = 0; iVar1 != iVar3; iVar3 = iVar3 + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                         (&(this->shape_).super_RepeatedPtrFieldBase,iVar3);
    puVar2 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::BlobShape>(6,value_00,deterministic,puVar2)
    ;
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return puVar2;
  }
  unknown_fields = DummyDataParameter::unknown_fields(this);
  puVar2 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,puVar2);
  return puVar2;
}

Assistant:

::google::protobuf::uint8* DummyDataParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.DummyDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .caffe.FillerParameter data_filler = 1;
  for (unsigned int i = 0, n = this->data_filler_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, this->data_filler(i), deterministic, target);
  }

  // repeated uint32 num = 2;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(2, this->num_, target);

  // repeated uint32 channels = 3;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(3, this->channels_, target);

  // repeated uint32 height = 4;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(4, this->height_, target);

  // repeated uint32 width = 5;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(5, this->width_, target);

  // repeated .caffe.BlobShape shape = 6;
  for (unsigned int i = 0, n = this->shape_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->shape(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.DummyDataParameter)
  return target;
}